

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

uint8_t * __thiscall
google::protobuf::internal::ExtensionSet::Extension::InternalSerializeFieldWithCachedSizesToArray
          (Extension *this,MessageLite *extendee,ExtensionSet *extension_set,int number,
          uint8_t *target,EpsCopyOutputStream *stream)

{
  uint8_t *puVar1;
  anon_union_8_9_fdc4a54a_for_Extension_0 value;
  bool bVar2;
  EpsCopyOutputStream *pEVar3;
  uint32_t uVar4;
  ptrdiff_t pVar5;
  int iVar6;
  FieldType FVar7;
  int iVar8;
  const_reference puVar9;
  const_reference piVar10;
  const_reference plVar11;
  const_reference puVar12;
  const_reference pfVar13;
  const_reference pdVar14;
  const_reference pbVar15;
  LogMessage *pLVar16;
  void *pvVar17;
  const_reference pMVar18;
  MessageLite *pMVar19;
  byte *pbVar20;
  MessageLite *prototype;
  MessageLite *msg;
  int local_1e0;
  int i_31;
  int i_30;
  int i_29;
  int i_28;
  int i_27;
  int i_26;
  int i_25;
  int i_24;
  int i_23;
  int i_22;
  int i_21;
  int i_20;
  int i_19;
  int i_18;
  int i_17;
  int i_16;
  int i_15;
  int i_14;
  LogMessageFatal local_190 [23];
  Voidify local_179;
  int local_178;
  int local_174;
  int i_13;
  int i_12;
  int i_11;
  int i_10;
  int i_9;
  int i_8;
  int i_7;
  int i_6;
  int i_5;
  int i_4;
  int i_3;
  int i_2;
  int i_1;
  int i;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  ExtensionSet *pEStack_128;
  int number_local;
  ExtensionSet *extension_set_local;
  MessageLite *extendee_local;
  Extension *this_local;
  size_t local_108;
  ptrdiff_t size_3;
  anon_union_8_9_fdc4a54a_for_Extension_0 local_f8;
  uint32_t local_ec;
  EpsCopyOutputStream *local_e8;
  EpsCopyOutputStream *local_e0;
  size_t local_d8;
  ptrdiff_t size_2;
  anon_union_8_9_fdc4a54a_for_Extension_0 local_c8;
  uint32_t local_bc;
  EpsCopyOutputStream *local_b8;
  EpsCopyOutputStream *local_b0;
  size_t local_a8;
  ptrdiff_t size_1;
  const_reference local_98;
  uint32_t local_8c;
  EpsCopyOutputStream *local_88;
  EpsCopyOutputStream *local_80;
  size_t local_78;
  ptrdiff_t size;
  const_reference local_68;
  uint32_t local_5c;
  EpsCopyOutputStream *local_58;
  EpsCopyOutputStream *local_50;
  byte *local_48;
  uint local_3c;
  byte *local_38;
  uint local_2c;
  byte *local_28;
  uint local_1c;
  byte *local_18;
  uint local_c;
  
  _i_1 = stream;
  stream_local = (EpsCopyOutputStream *)target;
  target_local._4_4_ = number;
  pEStack_128 = extension_set;
  extension_set_local = (ExtensionSet *)extendee;
  extendee_local = (MessageLite *)this;
  if ((this->is_repeated & 1U) == 0) {
    if (((byte)this->field_0xa >> 1 & 1) == 0) {
      FVar7 = anon_unknown_58::real_type(this->type);
      uVar4 = target_local._4_4_;
      switch(FVar7) {
      case TYPE_DOUBLE:
        stream_local = (EpsCopyOutputStream *)
                       io::EpsCopyOutputStream::EnsureSpace(_i_1,(uint8_t *)stream_local);
        stream_local = (EpsCopyOutputStream *)
                       WireFormatLite::WriteDoubleToArray
                                 (target_local._4_4_,(this->field_0).double_value,
                                  (uint8_t *)stream_local);
        break;
      case TYPE_FLOAT:
        stream_local = (EpsCopyOutputStream *)
                       io::EpsCopyOutputStream::EnsureSpace(_i_1,(uint8_t *)stream_local);
        stream_local = (EpsCopyOutputStream *)
                       WireFormatLite::WriteFloatToArray
                                 (target_local._4_4_,(this->field_0).float_value,
                                  (uint8_t *)stream_local);
        break;
      case TYPE_INT64:
        stream_local = (EpsCopyOutputStream *)
                       io::EpsCopyOutputStream::EnsureSpace(_i_1,(uint8_t *)stream_local);
        stream_local = (EpsCopyOutputStream *)
                       WireFormatLite::WriteInt64ToArray
                                 (target_local._4_4_,(this->field_0).int64_t_value,
                                  (uint8_t *)stream_local);
        break;
      case TYPE_UINT64:
        stream_local = (EpsCopyOutputStream *)
                       io::EpsCopyOutputStream::EnsureSpace(_i_1,(uint8_t *)stream_local);
        stream_local = (EpsCopyOutputStream *)
                       WireFormatLite::WriteUInt64ToArray
                                 (target_local._4_4_,(this->field_0).uint64_t_value,
                                  (uint8_t *)stream_local);
        break;
      case TYPE_INT32:
        stream_local = (EpsCopyOutputStream *)
                       io::EpsCopyOutputStream::EnsureSpace(_i_1,(uint8_t *)stream_local);
        stream_local = (EpsCopyOutputStream *)
                       WireFormatLite::WriteInt32ToArray
                                 (target_local._4_4_,(this->field_0).int32_t_value,
                                  (uint8_t *)stream_local);
        break;
      case TYPE_FIXED64:
        stream_local = (EpsCopyOutputStream *)
                       io::EpsCopyOutputStream::EnsureSpace(_i_1,(uint8_t *)stream_local);
        stream_local = (EpsCopyOutputStream *)
                       WireFormatLite::WriteFixed64ToArray
                                 (target_local._4_4_,(this->field_0).uint64_t_value,
                                  (uint8_t *)stream_local);
        break;
      case TYPE_FIXED32:
        stream_local = (EpsCopyOutputStream *)
                       io::EpsCopyOutputStream::EnsureSpace(_i_1,(uint8_t *)stream_local);
        stream_local = (EpsCopyOutputStream *)
                       WireFormatLite::WriteFixed32ToArray
                                 (target_local._4_4_,(this->field_0).uint32_t_value,
                                  (uint8_t *)stream_local);
        break;
      case TYPE_BOOL:
        stream_local = (EpsCopyOutputStream *)
                       io::EpsCopyOutputStream::EnsureSpace(_i_1,(uint8_t *)stream_local);
        stream_local = (EpsCopyOutputStream *)
                       WireFormatLite::WriteBoolToArray
                                 (target_local._4_4_,(bool)((this->field_0).bool_value & 1),
                                  (uint8_t *)stream_local);
        break;
      case TYPE_STRING:
        stream_local = (EpsCopyOutputStream *)
                       io::EpsCopyOutputStream::EnsureSpace(_i_1,(uint8_t *)stream_local);
        pEVar3 = _i_1;
        local_c8 = this->field_0;
        local_b8 = _i_1;
        local_bc = target_local._4_4_;
        size_2 = (ptrdiff_t)stream_local;
        local_d8 = std::__cxx11::string::size();
        pVar5 = size_2;
        bVar2 = true;
        if ((long)local_d8 < 0x80) {
          puVar1 = pEVar3->end_;
          iVar6 = io::EpsCopyOutputStream::TagSize(local_bc << 3);
          bVar2 = (long)(puVar1 + (-(long)iVar6 - pVar5) + 0xf) < (long)local_d8;
        }
        if (bVar2) {
          local_b0 = (EpsCopyOutputStream *)
                     io::EpsCopyOutputStream::WriteStringOutline
                               (pEVar3,local_bc,(string *)local_c8,(uint8_t *)size_2);
        }
        else {
          local_28 = (byte *)size_2;
          for (local_1c = local_bc << 3 | 2; 0x7f < local_1c; local_1c = local_1c >> 7) {
            *local_28 = (byte)local_1c | 0x80;
            local_28 = local_28 + 1;
          }
          *local_28 = (byte)local_1c;
          pbVar20 = local_28 + 2;
          local_28[1] = (byte)local_d8;
          size_2 = (ptrdiff_t)pbVar20;
          local_28 = local_28 + 1;
          pvVar17 = (void *)std::__cxx11::string::data();
          memcpy(pbVar20,pvVar17,local_d8);
          local_b0 = (EpsCopyOutputStream *)(size_2 + local_d8);
        }
        stream_local = local_b0;
        break;
      case TYPE_GROUP:
        stream_local = (EpsCopyOutputStream *)
                       io::EpsCopyOutputStream::EnsureSpace(_i_1,(uint8_t *)stream_local);
        stream_local = (EpsCopyOutputStream *)
                       WireFormatLite::InternalWriteGroup
                                 (target_local._4_4_,(MessageLite *)this->field_0,
                                  (uint8_t *)stream_local,_i_1);
        break;
      case TYPE_MESSAGE:
        if (((byte)this->field_0xa >> 2 & 1) == 0) {
          value = this->field_0;
          iVar6 = MessageLite::GetCachedSize(this->field_0);
          stream_local = (EpsCopyOutputStream *)
                         WireFormatLite::InternalWriteMessage
                                   (uVar4,(MessageLite *)value,iVar6,(uint8_t *)stream_local,_i_1);
        }
        else {
          pMVar19 = GetPrototypeForLazyMessage
                              (pEStack_128,(MessageLite *)extension_set_local,target_local._4_4_);
          stream_local = (EpsCopyOutputStream *)
                         (**(code **)(**(long **)&(this->field_0).int32_t_value + 0x98))
                                   (*(long **)&(this->field_0).int32_t_value,pMVar19,
                                    target_local._4_4_,stream_local,_i_1);
        }
        break;
      case TYPE_BYTES:
        stream_local = (EpsCopyOutputStream *)
                       io::EpsCopyOutputStream::EnsureSpace(_i_1,(uint8_t *)stream_local);
        pEVar3 = _i_1;
        local_f8 = this->field_0;
        local_e8 = _i_1;
        local_ec = target_local._4_4_;
        size_3 = (ptrdiff_t)stream_local;
        local_108 = std::__cxx11::string::size();
        pVar5 = size_3;
        bVar2 = true;
        if ((long)local_108 < 0x80) {
          puVar1 = pEVar3->end_;
          iVar6 = io::EpsCopyOutputStream::TagSize(local_ec << 3);
          bVar2 = (long)(puVar1 + (-(long)iVar6 - pVar5) + 0xf) < (long)local_108;
        }
        if (bVar2) {
          local_e0 = (EpsCopyOutputStream *)
                     io::EpsCopyOutputStream::WriteStringOutline
                               (pEVar3,local_ec,(string *)local_f8,(uint8_t *)size_3);
        }
        else {
          local_18 = (byte *)size_3;
          for (local_c = local_ec << 3 | 2; 0x7f < local_c; local_c = local_c >> 7) {
            *local_18 = (byte)local_c | 0x80;
            local_18 = local_18 + 1;
          }
          *local_18 = (byte)local_c;
          pbVar20 = local_18 + 2;
          local_18[1] = (byte)local_108;
          size_3 = (ptrdiff_t)pbVar20;
          local_18 = local_18 + 1;
          pvVar17 = (void *)std::__cxx11::string::data();
          memcpy(pbVar20,pvVar17,local_108);
          local_e0 = (EpsCopyOutputStream *)(size_3 + local_108);
        }
        stream_local = local_e0;
        break;
      case TYPE_UINT32:
        stream_local = (EpsCopyOutputStream *)
                       io::EpsCopyOutputStream::EnsureSpace(_i_1,(uint8_t *)stream_local);
        stream_local = (EpsCopyOutputStream *)
                       WireFormatLite::WriteUInt32ToArray
                                 (target_local._4_4_,(this->field_0).uint32_t_value,
                                  (uint8_t *)stream_local);
        break;
      case TYPE_ENUM:
        stream_local = (EpsCopyOutputStream *)
                       io::EpsCopyOutputStream::EnsureSpace(_i_1,(uint8_t *)stream_local);
        stream_local = (EpsCopyOutputStream *)
                       WireFormatLite::WriteEnumToArray
                                 (target_local._4_4_,(this->field_0).enum_value,
                                  (uint8_t *)stream_local);
        break;
      case TYPE_SFIXED32:
        stream_local = (EpsCopyOutputStream *)
                       io::EpsCopyOutputStream::EnsureSpace(_i_1,(uint8_t *)stream_local);
        stream_local = (EpsCopyOutputStream *)
                       WireFormatLite::WriteSFixed32ToArray
                                 (target_local._4_4_,(this->field_0).int32_t_value,
                                  (uint8_t *)stream_local);
        break;
      case TYPE_SFIXED64:
        stream_local = (EpsCopyOutputStream *)
                       io::EpsCopyOutputStream::EnsureSpace(_i_1,(uint8_t *)stream_local);
        stream_local = (EpsCopyOutputStream *)
                       WireFormatLite::WriteSFixed64ToArray
                                 (target_local._4_4_,(this->field_0).int64_t_value,
                                  (uint8_t *)stream_local);
        break;
      case TYPE_SINT32:
        stream_local = (EpsCopyOutputStream *)
                       io::EpsCopyOutputStream::EnsureSpace(_i_1,(uint8_t *)stream_local);
        stream_local = (EpsCopyOutputStream *)
                       WireFormatLite::WriteSInt32ToArray
                                 (target_local._4_4_,(this->field_0).int32_t_value,
                                  (uint8_t *)stream_local);
        break;
      case MAX_FIELD_TYPE:
        stream_local = (EpsCopyOutputStream *)
                       io::EpsCopyOutputStream::EnsureSpace(_i_1,(uint8_t *)stream_local);
        stream_local = (EpsCopyOutputStream *)
                       WireFormatLite::WriteSInt64ToArray
                                 (target_local._4_4_,(this->field_0).int64_t_value,
                                  (uint8_t *)stream_local);
      }
    }
  }
  else if ((this->is_packed & 1U) == 0) {
    FVar7 = anon_unknown_58::real_type(this->type);
    switch(FVar7) {
    case TYPE_DOUBLE:
      for (i_27 = 0; iVar6 = RepeatedField<double>::size(this->field_0), i_27 < iVar6;
          i_27 = i_27 + 1) {
        stream_local = (EpsCopyOutputStream *)
                       io::EpsCopyOutputStream::EnsureSpace(_i_1,(uint8_t *)stream_local);
        uVar4 = target_local._4_4_;
        pdVar14 = RepeatedField<double>::Get((RepeatedField<double> *)this->field_0,i_27);
        stream_local = (EpsCopyOutputStream *)
                       WireFormatLite::WriteDoubleToArray(uVar4,*pdVar14,(uint8_t *)stream_local);
      }
      break;
    case TYPE_FLOAT:
      for (i_26 = 0; iVar6 = RepeatedField<float>::size(this->field_0), i_26 < iVar6;
          i_26 = i_26 + 1) {
        stream_local = (EpsCopyOutputStream *)
                       io::EpsCopyOutputStream::EnsureSpace(_i_1,(uint8_t *)stream_local);
        uVar4 = target_local._4_4_;
        pfVar13 = RepeatedField<float>::Get((RepeatedField<float> *)this->field_0,i_26);
        stream_local = (EpsCopyOutputStream *)
                       WireFormatLite::WriteFloatToArray(uVar4,*pfVar13,(uint8_t *)stream_local);
      }
      break;
    case TYPE_INT64:
      for (i_17 = 0; iVar6 = RepeatedField<long>::size(this->field_0), i_17 < iVar6; i_17 = i_17 + 1
          ) {
        stream_local = (EpsCopyOutputStream *)
                       io::EpsCopyOutputStream::EnsureSpace(_i_1,(uint8_t *)stream_local);
        uVar4 = target_local._4_4_;
        plVar11 = RepeatedField<long>::Get((RepeatedField<long> *)this->field_0,i_17);
        stream_local = (EpsCopyOutputStream *)
                       WireFormatLite::WriteInt64ToArray(uVar4,*plVar11,(uint8_t *)stream_local);
      }
      break;
    case TYPE_UINT64:
      for (i_19 = 0; iVar6 = RepeatedField<unsigned_long>::size(this->field_0), i_19 < iVar6;
          i_19 = i_19 + 1) {
        stream_local = (EpsCopyOutputStream *)
                       io::EpsCopyOutputStream::EnsureSpace(_i_1,(uint8_t *)stream_local);
        uVar4 = target_local._4_4_;
        puVar12 = RepeatedField<unsigned_long>::Get
                            ((RepeatedField<unsigned_long> *)this->field_0,i_19);
        stream_local = (EpsCopyOutputStream *)
                       WireFormatLite::WriteUInt64ToArray(uVar4,*puVar12,(uint8_t *)stream_local);
      }
      break;
    case TYPE_INT32:
      for (i_16 = 0; iVar6 = RepeatedField<int>::size(this->field_0), i_16 < iVar6; i_16 = i_16 + 1)
      {
        stream_local = (EpsCopyOutputStream *)
                       io::EpsCopyOutputStream::EnsureSpace(_i_1,(uint8_t *)stream_local);
        uVar4 = target_local._4_4_;
        piVar10 = RepeatedField<int>::Get((RepeatedField<int> *)this->field_0,i_16);
        stream_local = (EpsCopyOutputStream *)
                       WireFormatLite::WriteInt32ToArray(uVar4,*piVar10,(uint8_t *)stream_local);
      }
      break;
    case TYPE_FIXED64:
      for (i_23 = 0; iVar6 = RepeatedField<unsigned_long>::size(this->field_0), i_23 < iVar6;
          i_23 = i_23 + 1) {
        stream_local = (EpsCopyOutputStream *)
                       io::EpsCopyOutputStream::EnsureSpace(_i_1,(uint8_t *)stream_local);
        uVar4 = target_local._4_4_;
        puVar12 = RepeatedField<unsigned_long>::Get
                            ((RepeatedField<unsigned_long> *)this->field_0,i_23);
        stream_local = (EpsCopyOutputStream *)
                       WireFormatLite::WriteFixed64ToArray(uVar4,*puVar12,(uint8_t *)stream_local);
      }
      break;
    case TYPE_FIXED32:
      for (i_22 = 0; iVar6 = RepeatedField<unsigned_int>::size(this->field_0), i_22 < iVar6;
          i_22 = i_22 + 1) {
        stream_local = (EpsCopyOutputStream *)
                       io::EpsCopyOutputStream::EnsureSpace(_i_1,(uint8_t *)stream_local);
        uVar4 = target_local._4_4_;
        puVar9 = RepeatedField<unsigned_int>::Get((RepeatedField<unsigned_int> *)this->field_0,i_22)
        ;
        stream_local = (EpsCopyOutputStream *)
                       WireFormatLite::WriteFixed32ToArray(uVar4,*puVar9,(uint8_t *)stream_local);
      }
      break;
    case TYPE_BOOL:
      for (i_28 = 0; iVar6 = RepeatedField<bool>::size(this->field_0), i_28 < iVar6; i_28 = i_28 + 1
          ) {
        stream_local = (EpsCopyOutputStream *)
                       io::EpsCopyOutputStream::EnsureSpace(_i_1,(uint8_t *)stream_local);
        uVar4 = target_local._4_4_;
        pbVar15 = RepeatedField<bool>::Get((RepeatedField<bool> *)this->field_0,i_28);
        stream_local = (EpsCopyOutputStream *)
                       WireFormatLite::WriteBoolToArray
                                 (uVar4,(bool)(*pbVar15 & 1),(uint8_t *)stream_local);
      }
      break;
    case TYPE_STRING:
      for (i_30 = 0;
          iVar6 = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::size(this->field_0), i_30 < iVar6; i_30 = i_30 + 1) {
        stream_local = (EpsCopyOutputStream *)
                       io::EpsCopyOutputStream::EnsureSpace(_i_1,(uint8_t *)stream_local);
        uVar4 = target_local._4_4_;
        pEVar3 = _i_1;
        local_68 = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::Get((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)this->field_0,i_30);
        local_58 = pEVar3;
        local_5c = uVar4;
        size = (ptrdiff_t)stream_local;
        local_78 = std::__cxx11::string::size();
        pVar5 = size;
        bVar2 = true;
        if ((long)local_78 < 0x80) {
          puVar1 = pEVar3->end_;
          iVar6 = io::EpsCopyOutputStream::TagSize(local_5c << 3);
          bVar2 = (long)(puVar1 + (-(long)iVar6 - pVar5) + 0xf) < (long)local_78;
        }
        if (bVar2) {
          local_50 = (EpsCopyOutputStream *)
                     io::EpsCopyOutputStream::WriteStringOutline
                               (pEVar3,local_5c,local_68,(uint8_t *)size);
        }
        else {
          local_48 = (byte *)size;
          for (local_3c = local_5c << 3 | 2; 0x7f < local_3c; local_3c = local_3c >> 7) {
            *local_48 = (byte)local_3c | 0x80;
            local_48 = local_48 + 1;
          }
          *local_48 = (byte)local_3c;
          pbVar20 = local_48 + 2;
          local_48[1] = (byte)local_78;
          size = (ptrdiff_t)pbVar20;
          local_48 = local_48 + 1;
          pvVar17 = (void *)std::__cxx11::string::data();
          memcpy(pbVar20,pvVar17,local_78);
          local_50 = (EpsCopyOutputStream *)(size + local_78);
        }
        stream_local = local_50;
      }
      break;
    case TYPE_GROUP:
      for (local_1e0 = 0;
          iVar6 = RepeatedPtrField<google::protobuf::MessageLite>::size(this->field_0),
          local_1e0 < iVar6; local_1e0 = local_1e0 + 1) {
        stream_local = (EpsCopyOutputStream *)
                       io::EpsCopyOutputStream::EnsureSpace(_i_1,(uint8_t *)stream_local);
        uVar4 = target_local._4_4_;
        pMVar18 = RepeatedPtrField<google::protobuf::MessageLite>::Get
                            ((RepeatedPtrField<google::protobuf::MessageLite> *)this->field_0,
                             local_1e0);
        stream_local = (EpsCopyOutputStream *)
                       WireFormatLite::InternalWriteGroup
                                 (uVar4,pMVar18,(uint8_t *)stream_local,_i_1);
      }
      break;
    case TYPE_MESSAGE:
      for (msg._4_4_ = 0;
          iVar6 = RepeatedPtrField<google::protobuf::MessageLite>::size(this->field_0),
          msg._4_4_ < iVar6; msg._4_4_ = msg._4_4_ + 1) {
        pMVar18 = RepeatedPtrField<google::protobuf::MessageLite>::Get
                            ((RepeatedPtrField<google::protobuf::MessageLite> *)this->field_0,
                             msg._4_4_);
        uVar4 = target_local._4_4_;
        iVar6 = MessageLite::GetCachedSize(pMVar18);
        stream_local = (EpsCopyOutputStream *)
                       WireFormatLite::InternalWriteMessage
                                 (uVar4,pMVar18,iVar6,(uint8_t *)stream_local,_i_1);
      }
      break;
    case TYPE_BYTES:
      for (i_31 = 0;
          iVar6 = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::size(this->field_0), i_31 < iVar6; i_31 = i_31 + 1) {
        stream_local = (EpsCopyOutputStream *)
                       io::EpsCopyOutputStream::EnsureSpace(_i_1,(uint8_t *)stream_local);
        uVar4 = target_local._4_4_;
        pEVar3 = _i_1;
        local_98 = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::Get((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)this->field_0,i_31);
        local_88 = pEVar3;
        local_8c = uVar4;
        size_1 = (ptrdiff_t)stream_local;
        local_a8 = std::__cxx11::string::size();
        pVar5 = size_1;
        bVar2 = true;
        if ((long)local_a8 < 0x80) {
          puVar1 = pEVar3->end_;
          iVar6 = io::EpsCopyOutputStream::TagSize(local_8c << 3);
          bVar2 = (long)(puVar1 + (-(long)iVar6 - pVar5) + 0xf) < (long)local_a8;
        }
        if (bVar2) {
          local_80 = (EpsCopyOutputStream *)
                     io::EpsCopyOutputStream::WriteStringOutline
                               (pEVar3,local_8c,local_98,(uint8_t *)size_1);
        }
        else {
          local_38 = (byte *)size_1;
          for (local_2c = local_8c << 3 | 2; 0x7f < local_2c; local_2c = local_2c >> 7) {
            *local_38 = (byte)local_2c | 0x80;
            local_38 = local_38 + 1;
          }
          *local_38 = (byte)local_2c;
          pbVar20 = local_38 + 2;
          local_38[1] = (byte)local_a8;
          size_1 = (ptrdiff_t)pbVar20;
          local_38 = local_38 + 1;
          pvVar17 = (void *)std::__cxx11::string::data();
          memcpy(pbVar20,pvVar17,local_a8);
          local_80 = (EpsCopyOutputStream *)(size_1 + local_a8);
        }
        stream_local = local_80;
      }
      break;
    case TYPE_UINT32:
      for (i_18 = 0; iVar6 = RepeatedField<unsigned_int>::size(this->field_0), i_18 < iVar6;
          i_18 = i_18 + 1) {
        stream_local = (EpsCopyOutputStream *)
                       io::EpsCopyOutputStream::EnsureSpace(_i_1,(uint8_t *)stream_local);
        uVar4 = target_local._4_4_;
        puVar9 = RepeatedField<unsigned_int>::Get((RepeatedField<unsigned_int> *)this->field_0,i_18)
        ;
        stream_local = (EpsCopyOutputStream *)
                       WireFormatLite::WriteUInt32ToArray(uVar4,*puVar9,(uint8_t *)stream_local);
      }
      break;
    case TYPE_ENUM:
      for (i_29 = 0; iVar6 = RepeatedField<int>::size(this->field_0), i_29 < iVar6; i_29 = i_29 + 1)
      {
        stream_local = (EpsCopyOutputStream *)
                       io::EpsCopyOutputStream::EnsureSpace(_i_1,(uint8_t *)stream_local);
        uVar4 = target_local._4_4_;
        piVar10 = RepeatedField<int>::Get((RepeatedField<int> *)this->field_0,i_29);
        stream_local = (EpsCopyOutputStream *)
                       WireFormatLite::WriteEnumToArray(uVar4,*piVar10,(uint8_t *)stream_local);
      }
      break;
    case TYPE_SFIXED32:
      for (i_24 = 0; iVar6 = RepeatedField<int>::size(this->field_0), i_24 < iVar6; i_24 = i_24 + 1)
      {
        stream_local = (EpsCopyOutputStream *)
                       io::EpsCopyOutputStream::EnsureSpace(_i_1,(uint8_t *)stream_local);
        uVar4 = target_local._4_4_;
        piVar10 = RepeatedField<int>::Get((RepeatedField<int> *)this->field_0,i_24);
        stream_local = (EpsCopyOutputStream *)
                       WireFormatLite::WriteSFixed32ToArray(uVar4,*piVar10,(uint8_t *)stream_local);
      }
      break;
    case TYPE_SFIXED64:
      for (i_25 = 0; iVar6 = RepeatedField<long>::size(this->field_0), i_25 < iVar6; i_25 = i_25 + 1
          ) {
        stream_local = (EpsCopyOutputStream *)
                       io::EpsCopyOutputStream::EnsureSpace(_i_1,(uint8_t *)stream_local);
        uVar4 = target_local._4_4_;
        plVar11 = RepeatedField<long>::Get((RepeatedField<long> *)this->field_0,i_25);
        stream_local = (EpsCopyOutputStream *)
                       WireFormatLite::WriteSFixed64ToArray(uVar4,*plVar11,(uint8_t *)stream_local);
      }
      break;
    case TYPE_SINT32:
      for (i_20 = 0; iVar6 = RepeatedField<int>::size(this->field_0), i_20 < iVar6; i_20 = i_20 + 1)
      {
        stream_local = (EpsCopyOutputStream *)
                       io::EpsCopyOutputStream::EnsureSpace(_i_1,(uint8_t *)stream_local);
        uVar4 = target_local._4_4_;
        piVar10 = RepeatedField<int>::Get((RepeatedField<int> *)this->field_0,i_20);
        stream_local = (EpsCopyOutputStream *)
                       WireFormatLite::WriteSInt32ToArray(uVar4,*piVar10,(uint8_t *)stream_local);
      }
      break;
    case MAX_FIELD_TYPE:
      for (i_21 = 0; iVar6 = RepeatedField<long>::size(this->field_0), i_21 < iVar6; i_21 = i_21 + 1
          ) {
        stream_local = (EpsCopyOutputStream *)
                       io::EpsCopyOutputStream::EnsureSpace(_i_1,(uint8_t *)stream_local);
        uVar4 = target_local._4_4_;
        plVar11 = RepeatedField<long>::Get((RepeatedField<long> *)this->field_0,i_21);
        stream_local = (EpsCopyOutputStream *)
                       WireFormatLite::WriteSInt64ToArray(uVar4,*plVar11,(uint8_t *)stream_local);
      }
    }
  }
  else {
    iVar6 = TrivialAtomicInt::operator()(&this->cached_size);
    if (iVar6 == 0) {
      return (uint8_t *)stream_local;
    }
    stream_local = (EpsCopyOutputStream *)
                   io::EpsCopyOutputStream::EnsureSpace(_i_1,(uint8_t *)stream_local);
    stream_local = (EpsCopyOutputStream *)
                   WireFormatLite::WriteTagToArray
                             (target_local._4_4_,WIRETYPE_LENGTH_DELIMITED,(uint8_t *)stream_local);
    iVar6 = TrivialAtomicInt::operator()(&this->cached_size);
    stream_local = (EpsCopyOutputStream *)
                   WireFormatLite::WriteInt32NoTagToArray(iVar6,(uint8_t *)stream_local);
    FVar7 = anon_unknown_58::real_type(this->type);
    switch(FVar7) {
    case TYPE_DOUBLE:
      for (i_13 = 0; iVar6 = i_13, iVar8 = RepeatedField<double>::size(this->field_0), iVar6 < iVar8
          ; i_13 = i_13 + 1) {
        stream_local = (EpsCopyOutputStream *)
                       io::EpsCopyOutputStream::EnsureSpace(_i_1,(uint8_t *)stream_local);
        pdVar14 = RepeatedField<double>::Get((RepeatedField<double> *)this->field_0,i_13);
        stream_local = (EpsCopyOutputStream *)
                       WireFormatLite::WriteDoubleNoTagToArray(*pdVar14,(uint8_t *)stream_local);
      }
      break;
    case TYPE_FLOAT:
      for (i_12 = 0; iVar6 = i_12, iVar8 = RepeatedField<float>::size(this->field_0), iVar6 < iVar8;
          i_12 = i_12 + 1) {
        stream_local = (EpsCopyOutputStream *)
                       io::EpsCopyOutputStream::EnsureSpace(_i_1,(uint8_t *)stream_local);
        pfVar13 = RepeatedField<float>::Get((RepeatedField<float> *)this->field_0,i_12);
        stream_local = (EpsCopyOutputStream *)
                       WireFormatLite::WriteFloatNoTagToArray(*pfVar13,(uint8_t *)stream_local);
      }
      break;
    case TYPE_INT64:
      for (i_3 = 0; iVar6 = i_3, iVar8 = RepeatedField<long>::size(this->field_0), iVar6 < iVar8;
          i_3 = i_3 + 1) {
        stream_local = (EpsCopyOutputStream *)
                       io::EpsCopyOutputStream::EnsureSpace(_i_1,(uint8_t *)stream_local);
        plVar11 = RepeatedField<long>::Get((RepeatedField<long> *)this->field_0,i_3);
        stream_local = (EpsCopyOutputStream *)
                       WireFormatLite::WriteInt64NoTagToArray(*plVar11,(uint8_t *)stream_local);
      }
      break;
    case TYPE_UINT64:
      for (i_5 = 0; iVar6 = i_5, iVar8 = RepeatedField<unsigned_long>::size(this->field_0),
          iVar6 < iVar8; i_5 = i_5 + 1) {
        stream_local = (EpsCopyOutputStream *)
                       io::EpsCopyOutputStream::EnsureSpace(_i_1,(uint8_t *)stream_local);
        puVar12 = RepeatedField<unsigned_long>::Get
                            ((RepeatedField<unsigned_long> *)this->field_0,i_5);
        stream_local = (EpsCopyOutputStream *)
                       WireFormatLite::WriteUInt64NoTagToArray(*puVar12,(uint8_t *)stream_local);
      }
      break;
    case TYPE_INT32:
      for (i_2 = 0; iVar6 = i_2, iVar8 = RepeatedField<int>::size(this->field_0), iVar6 < iVar8;
          i_2 = i_2 + 1) {
        stream_local = (EpsCopyOutputStream *)
                       io::EpsCopyOutputStream::EnsureSpace(_i_1,(uint8_t *)stream_local);
        piVar10 = RepeatedField<int>::Get((RepeatedField<int> *)this->field_0,i_2);
        stream_local = (EpsCopyOutputStream *)
                       WireFormatLite::WriteInt32NoTagToArray(*piVar10,(uint8_t *)stream_local);
      }
      break;
    case TYPE_FIXED64:
      for (i_9 = 0; iVar6 = i_9, iVar8 = RepeatedField<unsigned_long>::size(this->field_0),
          iVar6 < iVar8; i_9 = i_9 + 1) {
        stream_local = (EpsCopyOutputStream *)
                       io::EpsCopyOutputStream::EnsureSpace(_i_1,(uint8_t *)stream_local);
        puVar12 = RepeatedField<unsigned_long>::Get
                            ((RepeatedField<unsigned_long> *)this->field_0,i_9);
        stream_local = (EpsCopyOutputStream *)
                       WireFormatLite::WriteFixed64NoTagToArray(*puVar12,(uint8_t *)stream_local);
      }
      break;
    case TYPE_FIXED32:
      for (i_8 = 0; iVar6 = i_8, iVar8 = RepeatedField<unsigned_int>::size(this->field_0),
          iVar6 < iVar8; i_8 = i_8 + 1) {
        stream_local = (EpsCopyOutputStream *)
                       io::EpsCopyOutputStream::EnsureSpace(_i_1,(uint8_t *)stream_local);
        puVar9 = RepeatedField<unsigned_int>::Get((RepeatedField<unsigned_int> *)this->field_0,i_8);
        stream_local = (EpsCopyOutputStream *)
                       WireFormatLite::WriteFixed32NoTagToArray(*puVar9,(uint8_t *)stream_local);
      }
      break;
    case TYPE_BOOL:
      for (local_174 = 0; iVar6 = local_174, iVar8 = RepeatedField<bool>::size(this->field_0),
          iVar6 < iVar8; local_174 = local_174 + 1) {
        stream_local = (EpsCopyOutputStream *)
                       io::EpsCopyOutputStream::EnsureSpace(_i_1,(uint8_t *)stream_local);
        pbVar15 = RepeatedField<bool>::Get((RepeatedField<bool> *)this->field_0,local_174);
        stream_local = (EpsCopyOutputStream *)
                       WireFormatLite::WriteBoolNoTagToArray
                                 ((bool)(*pbVar15 & 1),(uint8_t *)stream_local);
      }
      break;
    case TYPE_STRING:
    case TYPE_GROUP:
    case TYPE_MESSAGE:
    case TYPE_BYTES:
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                (local_190,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/extension_set.cc"
                 ,0x70c);
      pLVar16 = absl::lts_20240722::log_internal::LogMessage::InternalStream
                          ((LogMessage *)local_190);
      pLVar16 = absl::lts_20240722::log_internal::LogMessage::operator<<
                          (pLVar16,(char (*) [37])"Non-primitive types can\'t be packed.");
      absl::lts_20240722::log_internal::Voidify::operator&&(&local_179,pLVar16);
      absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_190);
    case TYPE_UINT32:
      for (i_4 = 0; iVar6 = i_4, iVar8 = RepeatedField<unsigned_int>::size(this->field_0),
          iVar6 < iVar8; i_4 = i_4 + 1) {
        stream_local = (EpsCopyOutputStream *)
                       io::EpsCopyOutputStream::EnsureSpace(_i_1,(uint8_t *)stream_local);
        puVar9 = RepeatedField<unsigned_int>::Get((RepeatedField<unsigned_int> *)this->field_0,i_4);
        stream_local = (EpsCopyOutputStream *)
                       WireFormatLite::WriteUInt32NoTagToArray(*puVar9,(uint8_t *)stream_local);
      }
      break;
    case TYPE_ENUM:
      for (local_178 = 0; iVar6 = local_178, iVar8 = RepeatedField<int>::size(this->field_0),
          iVar6 < iVar8; local_178 = local_178 + 1) {
        stream_local = (EpsCopyOutputStream *)
                       io::EpsCopyOutputStream::EnsureSpace(_i_1,(uint8_t *)stream_local);
        piVar10 = RepeatedField<int>::Get((RepeatedField<int> *)this->field_0,local_178);
        stream_local = (EpsCopyOutputStream *)
                       WireFormatLite::WriteEnumNoTagToArray(*piVar10,(uint8_t *)stream_local);
      }
      break;
    case TYPE_SFIXED32:
      for (i_10 = 0; iVar6 = i_10, iVar8 = RepeatedField<int>::size(this->field_0), iVar6 < iVar8;
          i_10 = i_10 + 1) {
        stream_local = (EpsCopyOutputStream *)
                       io::EpsCopyOutputStream::EnsureSpace(_i_1,(uint8_t *)stream_local);
        piVar10 = RepeatedField<int>::Get((RepeatedField<int> *)this->field_0,i_10);
        stream_local = (EpsCopyOutputStream *)
                       WireFormatLite::WriteSFixed32NoTagToArray(*piVar10,(uint8_t *)stream_local);
      }
      break;
    case TYPE_SFIXED64:
      for (i_11 = 0; iVar6 = i_11, iVar8 = RepeatedField<long>::size(this->field_0), iVar6 < iVar8;
          i_11 = i_11 + 1) {
        stream_local = (EpsCopyOutputStream *)
                       io::EpsCopyOutputStream::EnsureSpace(_i_1,(uint8_t *)stream_local);
        plVar11 = RepeatedField<long>::Get((RepeatedField<long> *)this->field_0,i_11);
        stream_local = (EpsCopyOutputStream *)
                       WireFormatLite::WriteSFixed64NoTagToArray(*plVar11,(uint8_t *)stream_local);
      }
      break;
    case TYPE_SINT32:
      for (i_6 = 0; iVar6 = i_6, iVar8 = RepeatedField<int>::size(this->field_0), iVar6 < iVar8;
          i_6 = i_6 + 1) {
        stream_local = (EpsCopyOutputStream *)
                       io::EpsCopyOutputStream::EnsureSpace(_i_1,(uint8_t *)stream_local);
        piVar10 = RepeatedField<int>::Get((RepeatedField<int> *)this->field_0,i_6);
        stream_local = (EpsCopyOutputStream *)
                       WireFormatLite::WriteSInt32NoTagToArray(*piVar10,(uint8_t *)stream_local);
      }
      break;
    case MAX_FIELD_TYPE:
      for (i_7 = 0; iVar6 = i_7, iVar8 = RepeatedField<long>::size(this->field_0), iVar6 < iVar8;
          i_7 = i_7 + 1) {
        stream_local = (EpsCopyOutputStream *)
                       io::EpsCopyOutputStream::EnsureSpace(_i_1,(uint8_t *)stream_local);
        plVar11 = RepeatedField<long>::Get((RepeatedField<long> *)this->field_0,i_7);
        stream_local = (EpsCopyOutputStream *)
                       WireFormatLite::WriteSInt64NoTagToArray(*plVar11,(uint8_t *)stream_local);
      }
    }
  }
  return (uint8_t *)stream_local;
}

Assistant:

uint8_t* ExtensionSet::Extension::InternalSerializeFieldWithCachedSizesToArray(
    const MessageLite* extendee, const ExtensionSet* extension_set, int number,
    uint8_t* target, io::EpsCopyOutputStream* stream) const {
  if (is_repeated) {
    if (is_packed) {
      if (cached_size() == 0) return target;

      target = stream->EnsureSpace(target);
      target = WireFormatLite::WriteTagToArray(
          number, WireFormatLite::WIRETYPE_LENGTH_DELIMITED, target);
      target = WireFormatLite::WriteInt32NoTagToArray(cached_size(), target);

      switch (real_type(type)) {
#define HANDLE_TYPE(UPPERCASE, CAMELCASE, LOWERCASE)                     \
  case WireFormatLite::TYPE_##UPPERCASE:                                 \
    for (int i = 0; i < ptr.repeated_##LOWERCASE##_value->size(); i++) { \
      target = stream->EnsureSpace(target);                              \
      target = WireFormatLite::Write##CAMELCASE##NoTagToArray(           \
          ptr.repeated_##LOWERCASE##_value->Get(i), target);             \
    }                                                                    \
    break

        HANDLE_TYPE(INT32, Int32, int32_t);
        HANDLE_TYPE(INT64, Int64, int64_t);
        HANDLE_TYPE(UINT32, UInt32, uint32_t);
        HANDLE_TYPE(UINT64, UInt64, uint64_t);
        HANDLE_TYPE(SINT32, SInt32, int32_t);
        HANDLE_TYPE(SINT64, SInt64, int64_t);
        HANDLE_TYPE(FIXED32, Fixed32, uint32_t);
        HANDLE_TYPE(FIXED64, Fixed64, uint64_t);
        HANDLE_TYPE(SFIXED32, SFixed32, int32_t);
        HANDLE_TYPE(SFIXED64, SFixed64, int64_t);
        HANDLE_TYPE(FLOAT, Float, float);
        HANDLE_TYPE(DOUBLE, Double, double);
        HANDLE_TYPE(BOOL, Bool, bool);
        HANDLE_TYPE(ENUM, Enum, enum);
#undef HANDLE_TYPE

        case WireFormatLite::TYPE_STRING:
        case WireFormatLite::TYPE_BYTES:
        case WireFormatLite::TYPE_GROUP:
        case WireFormatLite::TYPE_MESSAGE:
          ABSL_LOG(FATAL) << "Non-primitive types can't be packed.";
          break;
      }
    } else {
      switch (real_type(type)) {
#define HANDLE_TYPE(UPPERCASE, CAMELCASE, LOWERCASE)                     \
  case WireFormatLite::TYPE_##UPPERCASE:                                 \
    for (int i = 0; i < ptr.repeated_##LOWERCASE##_value->size(); i++) { \
      target = stream->EnsureSpace(target);                              \
      target = WireFormatLite::Write##CAMELCASE##ToArray(                \
          number, ptr.repeated_##LOWERCASE##_value->Get(i), target);     \
    }                                                                    \
    break

        HANDLE_TYPE(INT32, Int32, int32_t);
        HANDLE_TYPE(INT64, Int64, int64_t);
        HANDLE_TYPE(UINT32, UInt32, uint32_t);
        HANDLE_TYPE(UINT64, UInt64, uint64_t);
        HANDLE_TYPE(SINT32, SInt32, int32_t);
        HANDLE_TYPE(SINT64, SInt64, int64_t);
        HANDLE_TYPE(FIXED32, Fixed32, uint32_t);
        HANDLE_TYPE(FIXED64, Fixed64, uint64_t);
        HANDLE_TYPE(SFIXED32, SFixed32, int32_t);
        HANDLE_TYPE(SFIXED64, SFixed64, int64_t);
        HANDLE_TYPE(FLOAT, Float, float);
        HANDLE_TYPE(DOUBLE, Double, double);
        HANDLE_TYPE(BOOL, Bool, bool);
        HANDLE_TYPE(ENUM, Enum, enum);
#undef HANDLE_TYPE
#define HANDLE_TYPE(UPPERCASE, CAMELCASE, LOWERCASE)                     \
  case WireFormatLite::TYPE_##UPPERCASE:                                 \
    for (int i = 0; i < ptr.repeated_##LOWERCASE##_value->size(); i++) { \
      target = stream->EnsureSpace(target);                              \
      target = stream->WriteString(                                      \
          number, ptr.repeated_##LOWERCASE##_value->Get(i), target);     \
    }                                                                    \
    break
        HANDLE_TYPE(STRING, String, string);
        HANDLE_TYPE(BYTES, Bytes, string);
#undef HANDLE_TYPE
        case WireFormatLite::TYPE_GROUP:
          for (int i = 0; i < ptr.repeated_message_value->size(); i++) {
            target = stream->EnsureSpace(target);
            target = WireFormatLite::InternalWriteGroup(
                number, ptr.repeated_message_value->Get(i), target, stream);
          }
          break;
        case WireFormatLite::TYPE_MESSAGE:
          for (int i = 0; i < ptr.repeated_message_value->size(); i++) {
            auto& msg = ptr.repeated_message_value->Get(i);
            target = WireFormatLite::InternalWriteMessage(
                number, msg, msg.GetCachedSize(), target, stream);
          }
          break;
      }
    }
  } else if (!is_cleared) {
    switch (real_type(type)) {
#define HANDLE_TYPE(UPPERCASE, CAMELCASE, VALUE)                               \
  case WireFormatLite::TYPE_##UPPERCASE:                                       \
    target = stream->EnsureSpace(target);                                      \
    target = WireFormatLite::Write##CAMELCASE##ToArray(number, VALUE, target); \
    break

      HANDLE_TYPE(INT32, Int32, int32_t_value);
      HANDLE_TYPE(INT64, Int64, int64_t_value);
      HANDLE_TYPE(UINT32, UInt32, uint32_t_value);
      HANDLE_TYPE(UINT64, UInt64, uint64_t_value);
      HANDLE_TYPE(SINT32, SInt32, int32_t_value);
      HANDLE_TYPE(SINT64, SInt64, int64_t_value);
      HANDLE_TYPE(FIXED32, Fixed32, uint32_t_value);
      HANDLE_TYPE(FIXED64, Fixed64, uint64_t_value);
      HANDLE_TYPE(SFIXED32, SFixed32, int32_t_value);
      HANDLE_TYPE(SFIXED64, SFixed64, int64_t_value);
      HANDLE_TYPE(FLOAT, Float, float_value);
      HANDLE_TYPE(DOUBLE, Double, double_value);
      HANDLE_TYPE(BOOL, Bool, bool_value);
      HANDLE_TYPE(ENUM, Enum, enum_value);
#undef HANDLE_TYPE
#define HANDLE_TYPE(UPPERCASE, CAMELCASE, VALUE)         \
  case WireFormatLite::TYPE_##UPPERCASE:                 \
    target = stream->EnsureSpace(target);                \
    target = stream->WriteString(number, VALUE, target); \
    break
      HANDLE_TYPE(STRING, String, *ptr.string_value);
      HANDLE_TYPE(BYTES, Bytes, *ptr.string_value);
#undef HANDLE_TYPE
      case WireFormatLite::TYPE_GROUP:
        target = stream->EnsureSpace(target);
        target = WireFormatLite::InternalWriteGroup(number, *ptr.message_value,
                                                    target, stream);
        break;
      case WireFormatLite::TYPE_MESSAGE:
        if (is_lazy) {
          const auto* prototype =
              extension_set->GetPrototypeForLazyMessage(extendee, number);
          target = ptr.lazymessage_value->WriteMessageToArray(prototype, number,
                                                              target, stream);
        } else {
          target = WireFormatLite::InternalWriteMessage(
              number, *ptr.message_value, ptr.message_value->GetCachedSize(),
              target, stream);
        }
        break;
    }
  }
  return target;
}